

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O0

int normal_scanComment(ENCODING *enc,char *ptr,char *end,char **nextTokPtr)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char **nextTokPtr_local;
  char *end_local;
  char *ptr_local;
  ENCODING *enc_local;
  
  if (ptr != end) {
    if (*ptr != '-') {
      *nextTokPtr = ptr;
      return 0;
    }
    pcVar3 = end;
    pcVar2 = ptr + 1;
    while (end_local = pcVar2, end_local != end) {
      switch(*(undefined1 *)((long)enc[1].scanners + (ulong)(byte)*end_local)) {
      case 0:
      case 1:
      case 8:
        *nextTokPtr = end_local;
        return 0;
      default:
        pcVar2 = end_local + 1;
        break;
      case 5:
        if ((long)end - (long)end_local < 2) {
          return -2;
        }
        iVar1 = (*enc[3].scanners[2])(enc,end_local,pcVar3,(char **)end_local);
        if (iVar1 != 0) {
          *nextTokPtr = end_local;
          return 0;
        }
        pcVar3 = extraout_RDX;
        pcVar2 = end_local + 2;
        break;
      case 6:
        if ((long)end - (long)end_local < 3) {
          return -2;
        }
        iVar1 = (*enc[3].scanners[3])(enc,end_local,pcVar3,(char **)end_local);
        if (iVar1 != 0) {
          *nextTokPtr = end_local;
          return 0;
        }
        pcVar3 = extraout_RDX_00;
        pcVar2 = end_local + 3;
        break;
      case 7:
        if ((long)end - (long)end_local < 4) {
          return -2;
        }
        iVar1 = (*enc[3].literalScanners[0])(enc,end_local,pcVar3,(char **)end_local);
        if (iVar1 != 0) {
          *nextTokPtr = end_local;
          return 0;
        }
        pcVar3 = extraout_RDX_01;
        pcVar2 = end_local + 4;
        break;
      case 0x1b:
        pcVar2 = end_local + 1;
        if (pcVar2 == end) {
          return -1;
        }
        if (*pcVar2 == '-') {
          pcVar3 = end_local + 2;
          if (pcVar3 == end) {
            return -1;
          }
          if (*pcVar3 == '>') {
            *nextTokPtr = end_local + 3;
            return 0xd;
          }
          *nextTokPtr = pcVar3;
          return 0;
        }
      }
    }
  }
  return -1;
}

Assistant:

static
int PREFIX(scanComment)(const ENCODING *enc, const char *ptr, const char *end,
                        const char **nextTokPtr)
{
  if (ptr != end) {
    if (!CHAR_MATCHES(enc, ptr, ASCII_MINUS)) {
      *nextTokPtr = ptr;
      return XML_TOK_INVALID;
    }
    ptr += MINBPC(enc);
    while (ptr != end) {
      switch (BYTE_TYPE(enc, ptr)) {
      INVALID_CASES(ptr, nextTokPtr)
      case BT_MINUS:
        if ((ptr += MINBPC(enc)) == end)
          return XML_TOK_PARTIAL;
        if (CHAR_MATCHES(enc, ptr, ASCII_MINUS)) {
          if ((ptr += MINBPC(enc)) == end)
            return XML_TOK_PARTIAL;
          if (!CHAR_MATCHES(enc, ptr, ASCII_GT)) {
            *nextTokPtr = ptr;
            return XML_TOK_INVALID;
          }
          *nextTokPtr = ptr + MINBPC(enc);
          return XML_TOK_COMMENT;
        }
        break;
      default:
        ptr += MINBPC(enc);
        break;
      }
    }
  }
  return XML_TOK_PARTIAL;
}